

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_field_sqrt(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  secp256k1_fe t;
  bench_inv *data;
  int j;
  int i;
  secp256k1_fe *in_stack_00000198;
  secp256k1_fe *in_stack_000001a0;
  undefined1 auStack_48 [40];
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = 0;
  local_20 = in_RDI;
  local_c = in_ESI;
  for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
    memcpy(auStack_48,(void *)(local_20 + 0x40),0x28);
    iVar1 = secp256k1_fe_sqrt(in_stack_000001a0,in_stack_00000198);
    local_14 = iVar1 + local_14;
    secp256k1_fe_impl_add((secp256k1_fe *)(local_20 + 0x40),(secp256k1_fe *)(local_20 + 0x68));
  }
  if (local_c < local_14) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_internal.c"
            ,0xfa,"test condition failed: j <= iters");
    abort();
  }
  return;
}

Assistant:

static void bench_field_sqrt(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_fe t;

    for (i = 0; i < iters; i++) {
        t = data->fe[0];
        j += secp256k1_fe_sqrt(&data->fe[0], &t);
        secp256k1_fe_add(&data->fe[0], &data->fe[1]);
    }
    CHECK(j <= iters);
}